

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

LargeHeapBlock * __thiscall
Memory::LargeHeapBucket::AddLargeHeapBlock(LargeHeapBucket *this,size_t size,bool nothrow)

{
  size_t *psVar1;
  Recycler *this_00;
  HeapInfo *pHVar2;
  code *pcVar3;
  size_t pageCount;
  bool bVar4;
  uint objectCount;
  IdleDecommitPageAllocator *pIVar5;
  char *address;
  LargeHeapBlock *this_01;
  size_t local_48;
  size_t realPageCount;
  Segment *local_38;
  Segment *segment;
  
  this_00 = ((this->super_HeapBucket).heapInfo)->recycler;
  local_48 = LargeHeapBlock::GetPagesNeeded(size,this->supportFreeList);
  if (local_48 == 0) {
    if (!nothrow) {
      Recycler::OutOfMemory(this_00);
    }
  }
  else {
    pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
    address = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::Alloc(&pIVar5->super_PageAllocator,&local_48,&local_38);
    pageCount = local_48;
    if (address != (char *)0x0) {
      Recycler::VerifyZeroFill(this_00,address,local_48 << 0xc);
      objectCount = LargeHeapBlock::GetMaxLargeObjectCount(pageCount,size);
      this_01 = LargeHeapBlock::New(address,pageCount,local_38,objectCount,this);
      if ((this_00->recyclerFlagsTable->Verbose == true) &&
         ((bVar4 = Js::Phases::IsEnabled(&this_00->recyclerFlagsTable->Trace,MemoryAllocationPhase),
          bVar4 || (bVar4 = Js::Phases::IsEnabled
                                      (&this_00->recyclerFlagsTable->Trace,
                                       LargeMemoryAllocationPhase), bVar4)))) {
        Output::Print(L"Allocated new large heap block 0x%p for sizeCat 0x%x\n",this_01,
                      (ulong)(this->super_HeapBucket).sizeCat);
      }
      if (this_01 == (LargeHeapBlock *)0x0) {
        pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::SuspendIdleDecommit(&pIVar5->super_PageAllocator);
        pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::Release(&pIVar5->super_PageAllocator,address,pageCount,local_38);
        pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ResumeIdleDecommit(&pIVar5->super_PageAllocator);
      }
      else {
        psVar1 = &(this_00->autoHeap).uncollectedNewPageCount;
        *psVar1 = *psVar1 + pageCount;
        pHVar2 = (this->super_HeapBucket).heapInfo;
        psVar1 = pHVar2->heapBlockCount + 0xb;
        *psVar1 = *psVar1 + 1;
        this_01->heapInfo = pHVar2;
        this_01->lastCollectAllocCount = 0;
        if ((this_00->collectionState).value == CollectionStateMark) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          realPageCount = __tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)realPageCount = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x162,"(recycler->collectionState != CollectionStateMark)",
                             "recycler->collectionState != CollectionStateMark");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *(undefined4 *)realPageCount = 0;
        }
        bVar4 = HeapBlockMap64::SetHeapBlock
                          (&this_00->heapBlockMap,address,pageCount,&this_01->super_HeapBlock,
                           LargeBlockType,'\0');
        if (bVar4) {
          this_01->next = this->largeBlockList;
          this->largeBlockList = this_01;
          return this_01;
        }
        pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::SuspendIdleDecommit(&pIVar5->super_PageAllocator);
        LargeHeapBlock::ReleasePages(this_01,this_00);
        pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ResumeIdleDecommit(&pIVar5->super_PageAllocator);
        LargeHeapBlock::Delete(this_01);
        psVar1 = ((this->super_HeapBucket).heapInfo)->heapBlockCount + 0xb;
        *psVar1 = *psVar1 - 1;
      }
    }
  }
  return (LargeHeapBlock *)0x0;
}

Assistant:

LargeHeapBlock*
LargeHeapBucket::AddLargeHeapBlock(size_t size, bool nothrow)
{
    Recycler* recycler = this->heapInfo->recycler;
    Segment * segment;
    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, this->supportFreeList);
    if (pageCount == 0)
    {
        if (nothrow == false)
        {
            // overflow
            // Since nothrow is false here, it's okay to throw
            recycler->OutOfMemory();
        }

        return nullptr;
    }

    char * address = nullptr;

    size_t realPageCount = pageCount;
    address = heapInfo->GetRecyclerLargeBlockPageAllocator()->Alloc(&realPageCount, &segment);
    pageCount = realPageCount;

    if (address == nullptr)
    {
        return nullptr;
    }
#ifdef RECYCLER_ZERO_MEM_CHECK
    recycler->VerifyZeroFill(address, pageCount * AutoSystemInfo::PageSize);
#endif
    uint objectCount = LargeHeapBlock::GetMaxLargeObjectCount(pageCount, size);
    LargeHeapBlock * heapBlock = LargeHeapBlock::New(address, pageCount, segment, objectCount, this);
#if DBG
    LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Allocated new large heap block 0x%p for sizeCat 0x%x\n"), heapBlock, sizeCat);
#endif

#ifdef ENABLE_JS_ETW
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (segment->GetPageCount() > heapInfo->GetRecyclerLargeBlockPageAllocator()->GetMaxAllocPageCount())
    {
        JS_ETW_INTERNAL(EventWriteJSCRIPT_INTERNAL_RECYCLER_EXTRALARGE_OBJECT_ALLOC(size));
    }
#endif
#endif
    if (!heapBlock)
    {       
        heapInfo->GetRecyclerLargeBlockPageAllocator()->SuspendIdleDecommit();
        heapInfo->GetRecyclerLargeBlockPageAllocator()->Release(address, pageCount, segment);
        heapInfo->GetRecyclerLargeBlockPageAllocator()->ResumeIdleDecommit();
        return nullptr;
    }
#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);

    heapBlock->heapInfo = this->heapInfo;

    heapBlock->lastCollectAllocCount = 0;

    Assert(recycler->collectionState != CollectionStateMark);

    if (!recycler->heapBlockMap.SetHeapBlock(address, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        heapInfo->GetRecyclerLargeBlockPageAllocator()->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        heapInfo->GetRecyclerLargeBlockPageAllocator()->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]--);
        return nullptr;
    }

    heapBlock->SetNextBlock(this->largeBlockList);
    this->largeBlockList = heapBlock;

    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);
    return heapBlock;
}